

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O0

void __thiscall slang::ast::UnrollVisitor::handle(UnrollVisitor *this,ConditionalStatement *stmt)

{
  bool bVar1;
  size_type in_RSI;
  Statement *in_RDI;
  ConstantValue result;
  Condition *cond;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL> *__range2;
  anon_class_16_2_3fdda46f fallback;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  EvalContext *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 local_68 [56];
  __normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
  local_30;
  Symbol *local_28;
  size_type local_10;
  
  if ((in_RDI->kind & 0x100) == Invalid) {
    local_28 = (Symbol *)(in_RSI + 0x20);
    local_10 = in_RSI;
    local_30._M_current =
         (Condition *)
         std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>
                     *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    local_68._48_8_ =
         std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>::end
                   ((span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>
                     *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffff70,
                              (__normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                               *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      local_68._40_8_ =
           __gnu_cxx::
           __normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
           ::operator*(&local_30);
      if ((((RandomizeDetails *)local_68._40_8_)->thisVar != (Symbol *)0x0) ||
         (bVar1 = step((UnrollVisitor *)
                       CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78)), !bVar1)) {
        handle::anon_class_16_2_3fdda46f::operator()
                  ((anon_class_16_2_3fdda46f *)in_stack_ffffffffffffff70);
        return;
      }
      not_null<const_slang::ast::Expression_*>::operator->
                ((not_null<const_slang::ast::Expression_*> *)0xa46b29);
      in_stack_ffffffffffffff70 = (EvalContext *)local_68;
      Expression::eval((Expression *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                       in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff7f =
           slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa46b4e);
      if ((bool)in_stack_ffffffffffffff7f) {
        in_stack_ffffffffffffff6f =
             slang::ConstantValue::isTrue((ConstantValue *)in_stack_ffffffffffffff70);
        if ((bool)in_stack_ffffffffffffff6f) {
          bVar1 = false;
        }
        else {
          if (*(long *)(local_10 + 0x38) != 0) {
            Statement::visit<slang::ast::UnrollVisitor&>
                      (in_RDI,(UnrollVisitor *)
                              CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
          }
          bVar1 = true;
        }
      }
      else {
        handle::anon_class_16_2_3fdda46f::operator()
                  ((anon_class_16_2_3fdda46f *)in_stack_ffffffffffffff70);
        bVar1 = true;
      }
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xa46bf0);
      if (bVar1) {
        return;
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
      ::operator++(&local_30);
    }
    Statement::visit<slang::ast::UnrollVisitor&>
              (in_RDI,(UnrollVisitor *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78)
              );
  }
  else {
    handle::anon_class_16_2_3fdda46f::operator()
              ((anon_class_16_2_3fdda46f *)in_stack_ffffffffffffff70);
  }
  return;
}

Assistant:

void handle(const ConditionalStatement& stmt) {
        // Evaluate the condition; if not constant visit both sides,
        // otherwise visit only the side that matches the condition.
        auto fallback = [&] {
            stmt.ifTrue.visit(*this);
            if (stmt.ifFalse)
                stmt.ifFalse->visit(*this);
        };

        if (setupMode) {
            fallback();
            return;
        }

        for (auto& cond : stmt.conditions) {
            if (cond.pattern || !step()) {
                fallback();
                return;
            }

            auto result = cond.expr->eval(evalCtx);
            if (!result) {
                fallback();
                return;
            }

            if (!result.isTrue()) {
                if (stmt.ifFalse)
                    stmt.ifFalse->visit(*this);
                return;
            }
        }

        stmt.ifTrue.visit(*this);
    }